

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_surface.cxx
# Opt level: O2

void __thiscall xray_re::xr_surface::~xr_surface(xr_surface *this)

{
  ~xr_surface(this);
  operator_delete(this,0xd0);
  return;
}

Assistant:

xr_surface::~xr_surface() {}